

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall
ktxValidator::addIssue<unsigned_int,unsigned_int>
          (ktxValidator *this,severity severity,issue *issue,uint args,uint args_1)

{
  issue *in_RDX;
  long in_RDI;
  uint in_stack_000001c8;
  uint in_stack_000001cc;
  issue *in_stack_000001d0;
  severity in_stack_000001dc;
  logger *in_stack_000001e0;
  
  ::issue::issue((issue *)(in_RDI + 0x78),in_RDX);
  logger::addIssue<unsigned_int,unsigned_int>
            (in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001cc,
             in_stack_000001c8);
  ::issue::~issue((issue *)0x115092);
  return;
}

Assistant:

void addIssue(logger::severity severity, issue issue, Args ... args)
    {
        logger.addIssue(severity, issue, args...);
    }